

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

RangeType __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_rangeTypeRational
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Rational *lower,Rational *upper)

{
  int iVar1;
  uint uVar2;
  RangeType RVar3;
  
  iVar1 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&lower->m_backend,&(this->_rationalNegInfty).m_backend);
  uVar2 = boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::compare(&upper->m_backend,&(this->_rationalPosInfty).m_backend);
  if (iVar1 < 1) {
    RVar3 = uVar2 >> 0x1e & ~RANGETYPE_LOWER;
  }
  else {
    RVar3 = RANGETYPE_LOWER;
    if ((int)uVar2 < 0) {
      iVar1 = boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::compare(&lower->m_backend,&upper->m_backend);
      RVar3 = (iVar1 == 0) + RANGETYPE_BOXED;
    }
  }
  return RVar3;
}

Assistant:

typename SoPlexBase<R>::RangeType SoPlexBase<R>::_rangeTypeRational(const Rational& lower,
      const Rational& upper) const
{
   assert(lower <= upper);

   if(lower <= _rationalNegInfty)
   {
      if(upper >= _rationalPosInfty)
         return RANGETYPE_FREE;
      else
         return RANGETYPE_UPPER;
   }
   else
   {
      if(upper >= _rationalPosInfty)
         return RANGETYPE_LOWER;
      else if(lower == upper)
         return RANGETYPE_FIXED;
      else
         return RANGETYPE_BOXED;
   }
}